

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

HasbitMode google::protobuf::internal::cpp::GetFieldHasbitMode(FieldDescriptor *field)

{
  bool bVar1;
  HasbitMode HVar2;
  OneofDescriptor *pOVar3;
  
  pOVar3 = FieldDescriptor::real_containing_oneof(field);
  if (((pOVar3 == (OneofDescriptor *)0x0) && ((field->options_->field_0)._impl_.weak_ == false)) &&
     ((field->field_0x1 & 8) == 0)) {
    bVar1 = FieldDescriptor::has_presence(field);
    HVar2 = kTrueHasbit;
    if (!bVar1) {
      bVar1 = FieldDescriptor::is_repeated(field);
      HVar2 = !bVar1 * '\x02';
    }
  }
  else {
    HVar2 = kNoHasbit;
  }
  return HVar2;
}

Assistant:

HasbitMode GetFieldHasbitMode(const FieldDescriptor* field) {
  // Do not generate hasbits for "real-oneof", weak, or extension fields.
  if (field->real_containing_oneof() || field->options().weak() ||
      field->is_extension()) {
    return HasbitMode::kNoHasbit;
  }

  // Explicit-presence fields always have true hasbits.
  if (field->has_presence()) {
    return HasbitMode::kTrueHasbit;
  }

  // Implicit presence fields.
  if (!field->is_repeated()) {
    return HasbitMode::kHintHasbit;
  }
  // We currently don't implement hasbits for implicit repeated fields.
  return HasbitMode::kNoHasbit;
}